

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
bk_lib::pod_vector<Clasp::ValueSet,std::allocator<Clasp::ValueSet>>::
insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::ValueSet>>
          (pod_vector<Clasp::ValueSet,std::allocator<Clasp::ValueSet>> *this,iterator pos,uint n,
          Fill<Clasp::ValueSet> *pred)

{
  void *__src;
  size_type sVar1;
  ValueSet *__dest;
  ulong __n;
  
  if (*(uint *)(this + 0xc) < *(uint *)(this + 8) + n) {
    sVar1 = pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::grow_size
                      ((pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *)this,n);
    __dest = __gnu_cxx::new_allocator<Clasp::ValueSet>::allocate
                       ((new_allocator<Clasp::ValueSet> *)this,(ulong)sVar1,(void *)0x0);
    __src = *(void **)this;
    if (__src == (void *)0x0) {
      __n = (ulong)pos & 0xffffffff;
    }
    else {
      __n = (ulong)(uint)((int)pos - (int)__src);
      memcpy(__dest,__src,__n);
    }
    detail::Fill<Clasp::ValueSet>::operator()(pred,__dest + __n,(ulong)n);
    if (pos != (iterator)0x0) {
      memcpy(__dest + __n + n,pos,((ulong)*(uint *)(this + 8) + *(long *)this) - (long)pos);
    }
    pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::ebo::release((ebo *)this);
    *(ValueSet **)this = __dest;
    *(uint *)(this + 8) = *(int *)(this + 8) + n;
    *(size_type *)(this + 0xc) = sVar1;
  }
  else {
    if (pos != (iterator)0x0) {
      memmove(pos + n,pos,((ulong)*(uint *)(this + 8) + *(long *)this) - (long)pos);
    }
    detail::Fill<Clasp::ValueSet>::operator()(pred,pos,(ulong)n);
    *(uint *)(this + 8) = *(int *)(this + 8) + n;
  }
  return;
}

Assistant:

void insert_impl(iterator pos, ST n, const P& pred) {
		assert(n == 0 || (size()+n) > size() );
		if (size()+n <= capacity()) {
			move_right(pos, n);
			pred(pos, n);
			ebo_.size += n;
		}
		else {
			size_type new_cap = grow_size(n);
			pointer temp      = ebo_.allocate(new_cap);
			size_type prefix  = static_cast<size_type>(pos-begin());
			// copy prefix
			if (const_pointer buf = begin()) {
				std::memcpy(temp, buf, prefix*sizeof(T));
			}
			// insert new stuff
			pred(temp+prefix, n);
			// copy suffix
			if (pos) {
				std::memcpy(temp+prefix+n, pos, (end()-pos)*sizeof(T));
			}
			ebo_.release();
			ebo_.buf  = temp;
			ebo_.size+= n;
			ebo_.cap  = new_cap;
		}
	}